

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example.cc
# Opt level: O2

substring __thiscall TC_parser<false>::read_name(TC_parser<false> *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  substring sVar4;
  
  pbVar2 = (byte *)this->reading_head;
  pbVar3 = pbVar2;
  while( true ) {
    bVar1 = *pbVar3;
    if (((((ulong)bVar1 < 0x3b) && ((0x400000100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
        (bVar1 == 0x7c)) || ((bVar1 == 0xd || (pbVar3 == (byte *)this->endLine)))) break;
    pbVar3 = pbVar3 + 1;
    this->reading_head = (char *)pbVar3;
  }
  sVar4.end = (char *)pbVar3;
  sVar4.begin = (char *)pbVar2;
  return sVar4;
}

Assistant:

inline substring read_name()
  {
    substring ret;
    ret.begin = reading_head;
    while (!(*reading_head == ' ' || *reading_head == ':' || *reading_head == '\t' || *reading_head == '|' ||
        reading_head == endLine || *reading_head == '\r'))
      ++reading_head;
    ret.end = reading_head;

    return ret;
  }